

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cc
# Opt level: O0

void anon_unknown.dwarf_146aa::insert_ordered<long>
               (list<long,_std::allocator<long>_> *thelist,long *elem)

{
  bool bVar1;
  reference plVar2;
  const_iterator local_30;
  _Self local_28;
  _Self local_20;
  iter ii;
  long *elem_local;
  list<long,_std::allocator<long>_> *thelist_local;
  
  ii._M_node = (_List_node_base *)elem;
  local_20._M_node =
       (_List_node_base *)std::__cxx11::list<long,_std::allocator<long>_>::begin(thelist);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)std::__cxx11::list<long,_std::allocator<long>_>::end(thelist);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      std::__cxx11::list<long,_std::allocator<long>_>::push_back(thelist,(value_type *)ii._M_node);
      return;
    }
    plVar2 = std::_List_iterator<long>::operator*(&local_20);
    if (*plVar2 <= (long)(ii._M_node)->_M_next) break;
    std::_List_iterator<long>::operator++(&local_20);
  }
  std::_List_const_iterator<long>::_List_const_iterator(&local_30,&local_20);
  std::__cxx11::list<long,_std::allocator<long>_>::insert(thelist,local_30,(value_type *)ii._M_node)
  ;
  return;
}

Assistant:

void insert_ordered(list<T> &thelist, const T &elem)
	{
		typedef typename list<T>::iterator iter;
		for (iter ii = thelist.begin(); ii != thelist.end(); ++ii)
			if (*ii <= elem) {
				thelist.insert(ii, elem);
				return;
			}
		thelist.push_back(elem);
	}